

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Mat *pMVar12;
  Mat *pMVar13;
  ulong uVar14;
  bool bVar15;
  long lVar16;
  int *piVar17;
  void *pvVar18;
  bool bVar19;
  uint7 in_register_00000011;
  Mat *pMVar20;
  long lVar21;
  byte bVar22;
  Mat *pMVar23;
  Mat *pMVar24;
  Mat *pMVar25;
  undefined7 in_register_00000089;
  void *pvVar26;
  void *pvVar27;
  ulong uVar28;
  long lVar29;
  int unaff_R14D;
  uint uVar30;
  uint uVar31;
  float fVar32;
  undefined4 in_stack_0000000c;
  void *ptr;
  Mat local_78;
  
  lVar16 = CONCAT44(in_stack_0000000c,keepdims);
  sVar1 = a->elemsize;
  iVar9 = a->dims;
  pMVar23 = b;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar9 == 2) {
      uVar11 = a->w;
      pMVar20 = (Mat *)(ulong)uVar11;
      uVar10 = a->h;
      pMVar13 = (Mat *)(long)(int)uVar10;
      bVar19 = !reduce_w;
      if (!bVar19 && reduce_h) {
        pMVar23 = (Mat *)0x1;
        Mat::create(b,1,sVar1,*(Allocator **)(lVar16 + 8));
        lVar16 = CONCAT44(in_stack_0000000c,keepdims);
        plVar5 = *(long **)(lVar16 + 0x10);
        if (uVar10 == 0) {
          piVar17 = (int *)0x0;
          pMVar12 = (Mat *)0x0;
        }
        else {
          uVar14 = sVar1 * (long)pMVar13 + 3 & 0xfffffffffffffffc;
          pMVar24 = (Mat *)(uVar14 + 4);
          if (plVar5 == (long *)0x0) {
            local_78.data = (Mat *)0x0;
            pMVar23 = (Mat *)0x10;
            iVar8 = posix_memalign(&local_78.data,0x10,(size_t)pMVar24);
            pMVar12 = (Mat *)local_78.data;
            if (iVar8 != 0) {
              local_78.data = (Mat *)0x0;
              pMVar12 = (Mat *)local_78.data;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))(plVar5);
            pMVar23 = pMVar24;
          }
          piVar17 = (int *)((long)&pMVar12->data + uVar14);
          *(undefined4 *)((long)&pMVar12->data + uVar14) = 1;
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
        }
        unaff_R14D = -100;
        if ((uVar10 != 0) && (pMVar12 != (Mat *)0x0)) {
          if ((int)uVar10 < 1) {
            fVar32 = 0.0;
          }
          else {
            pvVar18 = a->data;
            pMVar23 = (Mat *)((long)a->w * a->elemsize);
            pMVar24 = (Mat *)0x0;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar11) {
                pMVar25 = (Mat *)0x0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + (long)pMVar25 * 4));
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar20 != pMVar25);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar24 * 4) = fVar32;
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              pvVar18 = (void *)((long)&pMVar23->data + (long)pvVar18);
            } while (pMVar24 != pMVar13);
            fVar32 = 0.0;
            if (0 < (int)uVar10) {
              pMVar20 = (Mat *)0x0;
              do {
                fVar32 = fVar32 + *(float *)((long)&pMVar12->data + (long)pMVar20 * 4);
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar13 != pMVar20);
            }
          }
          *(float *)b->data = fVar32;
          unaff_R14D = 0;
        }
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 0x18))(plVar5);
              pMVar23 = pMVar12;
              goto LAB_0015009b;
            }
            if (pMVar12 != (Mat *)0x0) {
              free(pMVar12);
              lVar16 = CONCAT44(in_stack_0000000c,keepdims);
            }
          }
        }
LAB_001500ae:
        bVar19 = false;
      }
      else {
        pMVar23 = (Mat *)(CONCAT71(in_register_00000011,bVar19 || reduce_h) & 0xffffffff);
        if (!bVar19 && !reduce_h) {
          pMVar23 = (Mat *)(ulong)uVar10;
          Mat::create(b,uVar10,sVar1,*(Allocator **)(lVar16 + 8));
          if ((int)uVar10 < 1) {
            unaff_R14D = 0;
          }
          else {
            pvVar18 = a->data;
            iVar8 = a->w;
            pvVar26 = b->data;
            sVar2 = a->elemsize;
            pMVar23 = (Mat *)0x0;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar11) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar23 * 4) = fVar32;
              pMVar23 = (Mat *)((long)&pMVar23->data + 1);
              pvVar18 = (void *)((long)pvVar18 + (long)iVar8 * sVar2);
            } while (pMVar23 != pMVar13);
            unaff_R14D = 0;
          }
LAB_0015009b:
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
          goto LAB_001500ae;
        }
        if (reduce_h && !reduce_w) {
          pMVar23 = pMVar20;
          Mat::create(b,uVar11,sVar1,*(Allocator **)(lVar16 + 8));
          uVar30 = b->c * (int)b->cstep;
          if (0 < (int)uVar30) {
            pMVar23 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar30 << 2);
          }
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
          if (0 < (int)uVar10) {
            pvVar18 = a->data;
            iVar8 = a->w;
            pvVar26 = b->data;
            sVar2 = a->elemsize;
            pMVar23 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar12 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar26 + (long)pMVar12 * 4) =
                       ABS(*(float *)((long)pvVar18 + (long)pMVar12 * 4)) +
                       *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              pMVar23 = (Mat *)((long)&pMVar23->data + 1);
              pvVar18 = (void *)((long)pvVar18 + (long)iVar8 * sVar2);
            } while (pMVar23 != pMVar13);
          }
          unaff_R14D = 0;
          goto LAB_001500ae;
        }
        bVar19 = true;
      }
      in_register_00000011 = in_register_00000011 & 0xffffff;
      if (!bVar19) goto LAB_001509ae;
    }
    else if (iVar9 == 1) {
      iVar9 = a->w;
      pMVar23 = (Mat *)0x1;
      Mat::create(b,1,sVar1,*(Allocator **)(lVar16 + 8));
      if ((long)iVar9 < 1) goto LAB_0014f441;
      fVar32 = 0.0;
      lVar16 = 0;
      do {
        fVar32 = fVar32 + ABS(*(float *)((long)a->data + lVar16 * 4));
        lVar16 = lVar16 + 1;
      } while (iVar9 != lVar16);
      goto LAB_0014f444;
    }
    if (iVar9 != 3) goto LAB_001509ab;
    uVar11 = a->w;
    lVar29 = (long)(int)uVar11;
    uVar10 = a->h;
    uVar14 = (ulong)uVar10;
    uVar30 = a->c;
    lVar21 = (long)(int)uVar30;
    uVar31 = uVar10 * uVar11;
    bVar19 = !reduce_w;
    bVar6 = !reduce_h;
    bVar15 = !reduce_c;
    if ((!bVar19 && !bVar6) && !bVar15) {
      pMVar23 = (Mat *)0x1;
      Mat::create(b,1,sVar1,*(Allocator **)(lVar16 + 8));
      plVar5 = *(long **)(lVar16 + 0x10);
      if (uVar30 == 0) {
        piVar17 = (int *)0x0;
        pMVar13 = (Mat *)0x0;
      }
      else {
        uVar14 = sVar1 * lVar21 + 3 & 0xfffffffffffffffc;
        pMVar20 = (Mat *)(uVar14 + 4);
        if (plVar5 == (long *)0x0) {
          local_78.data = (Mat *)0x0;
          pMVar23 = (Mat *)0x10;
          iVar9 = posix_memalign(&local_78.data,0x10,(size_t)pMVar20);
          pMVar13 = (Mat *)local_78.data;
          if (iVar9 != 0) {
            local_78.data = (Mat *)0x0;
            pMVar13 = (Mat *)local_78.data;
          }
        }
        else {
          pMVar13 = (Mat *)(**(code **)(*plVar5 + 0x10))(plVar5);
          pMVar23 = pMVar20;
        }
        piVar17 = (int *)((long)&pMVar13->data + uVar14);
        *(undefined4 *)((long)&pMVar13->data + uVar14) = 1;
      }
      unaff_R14D = -100;
      if ((uVar30 != 0) && (pMVar13 != (Mat *)0x0)) {
        if ((int)uVar30 < 1) {
LAB_0015048f:
          fVar32 = 0.0;
        }
        else {
          sVar1 = a->elemsize;
          sVar2 = a->cstep;
          pMVar23 = (Mat *)a->data;
          lVar16 = 0;
          do {
            fVar32 = 0.0;
            if (0 < (int)uVar31) {
              uVar14 = 0;
              do {
                fVar32 = fVar32 + ABS(*(float *)((long)&pMVar23->data + uVar14 * 4));
                uVar14 = uVar14 + 1;
              } while (uVar31 != uVar14);
            }
            *(float *)((long)&pMVar13->data + lVar16 * 4) = fVar32;
            lVar16 = lVar16 + 1;
            pMVar23 = (Mat *)((long)&pMVar23->data + sVar1 * sVar2);
          } while (lVar16 != lVar21);
          if ((int)uVar30 < 1) goto LAB_0015048f;
          fVar32 = 0.0;
          lVar16 = 0;
          do {
            fVar32 = fVar32 + *(float *)((long)&pMVar13->data + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar21 != lVar16);
        }
        *(float *)b->data = fVar32;
        unaff_R14D = 0;
      }
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 != 0) goto LAB_001504d7;
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x18))(plVar5);
          pMVar23 = pMVar13;
          goto LAB_001504bb;
        }
LAB_001504c5:
        if (pMVar13 != (Mat *)0x0) {
          free(pMVar13);
        }
      }
      goto LAB_001504d7;
    }
    if ((bVar19 || bVar6) || reduce_c) {
      pMVar13 = (Mat *)(ulong)uVar11;
      uVar28 = CONCAT71(in_register_00000011,bVar19 || reduce_h) & 0xffffffff;
      bVar22 = (byte)uVar28 | reduce_c;
      pMVar23 = (Mat *)CONCAT71((int7)(uVar28 >> 8),bVar22);
      if (bVar22 != 0) {
        if ((bVar19 || reduce_h) || bVar15) {
          if ((!bVar6 && !reduce_w) && !bVar15) {
            Mat::create(b,uVar11,sVar1,*(Allocator **)(lVar16 + 8));
            local_78.elemsize._0_4_ = 0;
            local_78.elemsize._4_4_ = 0;
            local_78.elempack = 0;
            local_78.data = (Mat *)0x0;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.allocator = (Allocator *)0x0;
            local_78.dims = 0;
            local_78.w = 0;
            local_78.h = 0;
            local_78.c = 0;
            local_78.cstep = 0;
            pMVar23 = (Mat *)(ulong)uVar11;
            Mat::create(&local_78,uVar11,1,uVar30,sVar1,*(Allocator **)(lVar16 + 0x10));
            sVar1 = local_78.cstep;
            pMVar20 = (Mat *)local_78.data;
            unaff_R14D = -100;
            if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
              uVar31 = (int)local_78.cstep * local_78.c;
              if (0 < (int)uVar31) {
                pMVar23 = (Mat *)0x0;
                memset(local_78.data,0,(ulong)uVar31 << 2);
              }
              if (0 < (int)uVar30) {
                pvVar18 = a->data;
                sVar2 = a->elemsize;
                sVar3 = a->cstep;
                pMVar23 = (Mat *)(CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                                 sVar1);
                lVar16 = 0;
                pMVar12 = pMVar20;
                do {
                  if (0 < (int)uVar10) {
                    uVar31 = 0;
                    pvVar26 = pvVar18;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar24 = (Mat *)0x0;
                        do {
                          *(float *)((long)&pMVar12->data + (long)pMVar24 * 4) =
                               ABS(*(float *)((long)pvVar26 + (long)pMVar24 * 4)) +
                               *(float *)((long)&pMVar12->data + (long)pMVar24 * 4);
                          pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                        } while (pMVar13 != pMVar24);
                      }
                      uVar31 = uVar31 + 1;
                      pvVar26 = (void *)((long)pvVar26 + lVar29 * 4);
                    } while (uVar31 != uVar10);
                  }
                  lVar16 = lVar16 + 1;
                  pvVar18 = (void *)((long)pvVar18 + sVar2 * sVar3);
                  pMVar12 = (Mat *)((long)&pMVar23->data + (long)&pMVar12->data);
                } while (lVar16 != lVar21);
              }
              uVar10 = b->c * (int)b->cstep;
              if (0 < (int)uVar10) {
                pMVar23 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar10 << 2);
              }
              if (0 < (int)uVar30) {
                pMVar23 = (Mat *)(sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                   (undefined4)local_78.elemsize));
                pvVar18 = b->data;
                lVar16 = 0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar12 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar18 + (long)pMVar12 * 4) =
                           *(float *)((long)&pMVar20->data + (long)pMVar12 * 4) +
                           *(float *)((long)pvVar18 + (long)pMVar12 * 4);
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    } while (pMVar13 != pMVar12);
                  }
                  lVar16 = lVar16 + 1;
                  pMVar20 = (Mat *)((long)&pMVar23->data + (long)&pMVar20->data);
                } while (lVar16 != lVar21);
              }
              goto LAB_0015098e;
            }
            goto LAB_00150991;
          }
          if ((reduce_w || reduce_h) || bVar15) {
            bVar19 = true;
            if ((!bVar6 && !reduce_w) && !reduce_c) {
              pMVar23 = pMVar13;
              Mat::create(b,uVar11,uVar30,sVar1,*(Allocator **)(lVar16 + 8));
              uVar31 = b->c * (int)b->cstep;
              if (0 < (int)uVar31) {
                pMVar23 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar31 << 2);
              }
              if ((int)uVar30 < 1) goto LAB_001502fd;
              pvVar18 = a->data;
              sVar1 = a->elemsize;
              pMVar23 = (Mat *)b->data;
              iVar9 = b->w;
              sVar2 = b->elemsize;
              sVar3 = a->cstep;
              lVar16 = 0;
              unaff_R14D = 0;
              do {
                if (0 < (int)uVar10) {
                  uVar30 = 0;
                  pvVar26 = pvVar18;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar20 = (Mat *)0x0;
                      do {
                        *(float *)((long)&pMVar23->data + (long)pMVar20 * 4) =
                             ABS(*(float *)((long)pvVar26 + (long)pMVar20 * 4)) +
                             *(float *)((long)&pMVar23->data + (long)pMVar20 * 4);
                        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      } while (pMVar13 != pMVar20);
                    }
                    uVar30 = uVar30 + 1;
                    pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar11 * 4);
                  } while (uVar30 != uVar10);
                }
                lVar16 = lVar16 + 1;
                pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar3);
                pMVar23 = (Mat *)((long)&pMVar23->data + (long)iVar9 * sVar2);
                bVar19 = false;
              } while (lVar16 != lVar21);
            }
          }
          else {
            Mat::create(b,uVar11,uVar10,sVar1,*(Allocator **)(lVar16 + 8));
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              pMVar13 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            pMVar23 = pMVar13;
            if ((int)uVar30 < 1) goto LAB_001502f3;
            pvVar18 = a->data;
            sVar1 = a->elemsize;
            sVar2 = a->cstep;
            pMVar23 = (Mat *)b->data;
            lVar16 = 0;
            unaff_R14D = 0;
            do {
              if (0 < (int)uVar31) {
                uVar14 = 0;
                do {
                  *(float *)((long)&pMVar23->data + uVar14 * 4) =
                       ABS(*(float *)((long)pvVar18 + uVar14 * 4)) +
                       *(float *)((long)&pMVar23->data + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar31 != uVar14);
              }
              lVar16 = lVar16 + 1;
              pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
              bVar19 = false;
            } while (lVar16 != lVar21);
          }
          goto LAB_001509a7;
        }
        Mat::create(b,uVar10,sVar1,*(Allocator **)(lVar16 + 8));
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (Mat *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        pMVar23 = (Mat *)0x1;
        Mat::create(&local_78,1,uVar10,uVar30,sVar1,*(Allocator **)(lVar16 + 0x10));
        sVar1 = local_78.cstep;
        pMVar20 = (Mat *)local_78.data;
        unaff_R14D = -100;
        if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
          uVar31 = (int)local_78.cstep * local_78.c;
          if (0 < (int)uVar31) {
            pMVar23 = (Mat *)0x0;
            memset(local_78.data,0,(ulong)uVar31 << 2);
          }
          if (0 < (int)uVar30) {
            pvVar18 = a->data;
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pMVar23 = (Mat *)(lVar29 * 4);
            lVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar28 = 0;
                pvVar26 = pvVar18;
                do {
                  fVar32 = 0.0;
                  if (0 < (int)uVar11) {
                    pMVar12 = (Mat *)0x0;
                    do {
                      fVar32 = fVar32 + ABS(*(float *)((long)pvVar26 + (long)pMVar12 * 4));
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    } while (pMVar13 != pMVar12);
                  }
                  *(float *)((long)&pMVar20->data +
                            uVar28 * 4 +
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * sVar1
                            * lVar16) = fVar32;
                  uVar28 = uVar28 + 1;
                  pvVar26 = (void *)((long)&pMVar23->data + (long)pvVar26);
                } while (uVar28 != uVar14);
              }
              lVar16 = lVar16 + 1;
              pvVar18 = (void *)((long)pvVar18 + sVar2 * sVar3);
            } while (lVar16 != lVar21);
          }
          uVar11 = b->c * (int)b->cstep;
          if (0 < (int)uVar11) {
            pMVar23 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar11 << 2);
          }
          if (0 < (int)uVar30) {
            pMVar23 = (Mat *)(sVar1 * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize
                                              ));
            pvVar18 = b->data;
            lVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar28 = 0;
                do {
                  *(float *)((long)pvVar18 + uVar28 * 4) =
                       *(float *)((long)&pMVar20->data + uVar28 * 4) +
                       *(float *)((long)pvVar18 + uVar28 * 4);
                  uVar28 = uVar28 + 1;
                } while (uVar14 != uVar28);
              }
              lVar16 = lVar16 + 1;
              pMVar20 = (Mat *)((long)&pMVar23->data + (long)&pMVar20->data);
            } while (lVar16 != lVar21);
          }
          goto LAB_0015098e;
        }
        goto LAB_00150991;
      }
      pMVar23 = (Mat *)(ulong)uVar10;
      Mat::create(b,uVar10,uVar30,sVar1,*(Allocator **)(lVar16 + 8));
      if (0 < (int)uVar30) {
        pvVar18 = a->data;
        sVar1 = a->elemsize;
        pvVar26 = b->data;
        pMVar23 = (Mat *)((long)b->w * b->elemsize);
        sVar2 = a->cstep;
        lVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar28 = 0;
            pvVar27 = pvVar18;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar11) {
                pMVar20 = (Mat *)0x0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)pvVar27 + (long)pMVar20 * 4));
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar13 != pMVar20);
              }
              *(float *)((long)pvVar26 + uVar28 * 4 + (long)pMVar23 * lVar16) = fVar32;
              uVar28 = uVar28 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar29 * 4);
            } while (uVar28 != uVar14);
          }
          lVar16 = lVar16 + 1;
          pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
        } while (lVar16 != lVar21);
        goto LAB_001503bd;
      }
LAB_001503c7:
      bVar19 = false;
      unaff_R14D = 0;
      goto LAB_001509a7;
    }
    pMVar23 = (Mat *)(ulong)uVar30;
    Mat::create(b,uVar30,sVar1,*(Allocator **)(lVar16 + 8));
    if (0 < (int)uVar30) {
      pvVar18 = a->data;
      sVar1 = a->elemsize;
      sVar2 = a->cstep;
      pvVar26 = b->data;
      pMVar23 = (Mat *)(ulong)uVar31;
      lVar16 = 0;
      do {
        fVar32 = 0.0;
        if (0 < (int)uVar31) {
          pMVar13 = (Mat *)0x0;
          do {
            fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + (long)pMVar13 * 4));
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
          } while (pMVar23 != pMVar13);
        }
        *(float *)((long)pvVar26 + lVar16 * 4) = fVar32;
        lVar16 = lVar16 + 1;
        pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
      } while (lVar16 != lVar21);
      goto LAB_001502f3;
    }
LAB_001502fd:
    unaff_R14D = 0;
LAB_001504bb:
    bVar19 = false;
LAB_001509a7:
    if (!bVar19) goto LAB_001509ae;
  }
  else {
    if (iVar9 == 2) {
      uVar11 = a->w;
      pMVar20 = (Mat *)(ulong)uVar11;
      iVar8 = a->h;
      pMVar13 = (Mat *)(long)iVar8;
      bVar19 = !reduce_w;
      if (!bVar19 && reduce_h) {
        pMVar23 = (Mat *)0x1;
        Mat::create(b,1,1,sVar1,*(Allocator **)(lVar16 + 8));
        lVar16 = CONCAT44(in_stack_0000000c,keepdims);
        plVar5 = *(long **)(lVar16 + 0x10);
        if (iVar8 == 0) {
          piVar17 = (int *)0x0;
          pMVar12 = (Mat *)0x0;
        }
        else {
          uVar14 = sVar1 * (long)pMVar13 + 3 & 0xfffffffffffffffc;
          pMVar24 = (Mat *)(uVar14 + 4);
          if (plVar5 == (long *)0x0) {
            local_78.data = (Mat *)0x0;
            pMVar23 = (Mat *)0x10;
            iVar7 = posix_memalign(&local_78.data,0x10,(size_t)pMVar24);
            pMVar12 = (Mat *)local_78.data;
            if (iVar7 != 0) {
              local_78.data = (Mat *)0x0;
              pMVar12 = (Mat *)local_78.data;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))(plVar5);
            pMVar23 = pMVar24;
          }
          piVar17 = (int *)((long)&pMVar12->data + uVar14);
          *(undefined4 *)((long)&pMVar12->data + uVar14) = 1;
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
        }
        unaff_R14D = -100;
        if ((iVar8 != 0) && (pMVar12 != (Mat *)0x0)) {
          if (iVar8 < 1) {
            fVar32 = 0.0;
          }
          else {
            pvVar18 = a->data;
            pMVar23 = (Mat *)((long)a->w * a->elemsize);
            pMVar24 = (Mat *)0x0;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar11) {
                pMVar25 = (Mat *)0x0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + (long)pMVar25 * 4));
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar20 != pMVar25);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar24 * 4) = fVar32;
              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
              pvVar18 = (void *)((long)&pMVar23->data + (long)pvVar18);
            } while (pMVar24 != pMVar13);
            fVar32 = 0.0;
            if (0 < iVar8) {
              pMVar20 = (Mat *)0x0;
              do {
                fVar32 = fVar32 + *(float *)((long)&pMVar12->data + (long)pMVar20 * 4);
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar13 != pMVar20);
            }
          }
          *(float *)b->data = fVar32;
          unaff_R14D = 0;
        }
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 0x18))(plVar5);
              pMVar23 = pMVar12;
              goto LAB_0014fa35;
            }
            if (pMVar12 != (Mat *)0x0) {
              free(pMVar12);
              lVar16 = CONCAT44(in_stack_0000000c,keepdims);
            }
          }
        }
LAB_0014fa48:
        bVar19 = false;
      }
      else {
        pMVar23 = (Mat *)(CONCAT71(in_register_00000011,bVar19 || reduce_h) & 0xffffffff);
        if (!bVar19 && !reduce_h) {
          pMVar23 = (Mat *)0x1;
          Mat::create(b,1,iVar8,sVar1,*(Allocator **)(lVar16 + 8));
          if (iVar8 < 1) {
            unaff_R14D = 0;
          }
          else {
            pvVar18 = a->data;
            iVar8 = a->w;
            pvVar26 = b->data;
            sVar2 = a->elemsize;
            pMVar23 = (Mat *)0x0;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar11) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar23 * 4) = fVar32;
              pMVar23 = (Mat *)((long)&pMVar23->data + 1);
              pvVar18 = (void *)((long)pvVar18 + (long)iVar8 * sVar2);
            } while (pMVar23 != pMVar13);
            unaff_R14D = 0;
          }
LAB_0014fa35:
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
          goto LAB_0014fa48;
        }
        if (reduce_h && !reduce_w) {
          pMVar23 = pMVar20;
          Mat::create(b,uVar11,1,sVar1,*(Allocator **)(lVar16 + 8));
          uVar10 = b->c * (int)b->cstep;
          if (0 < (int)uVar10) {
            pMVar23 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar10 << 2);
          }
          lVar16 = CONCAT44(in_stack_0000000c,keepdims);
          if (0 < iVar8) {
            pvVar18 = a->data;
            iVar8 = a->w;
            pvVar26 = b->data;
            sVar2 = a->elemsize;
            pMVar23 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar12 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar26 + (long)pMVar12 * 4) =
                       ABS(*(float *)((long)pvVar18 + (long)pMVar12 * 4)) +
                       *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              pMVar23 = (Mat *)((long)&pMVar23->data + 1);
              pvVar18 = (void *)((long)pvVar18 + (long)iVar8 * sVar2);
            } while (pMVar23 != pMVar13);
          }
          unaff_R14D = 0;
          goto LAB_0014fa48;
        }
        bVar19 = true;
      }
      in_register_00000011 = in_register_00000011 & 0xffffff;
      if (!bVar19) goto LAB_001509ae;
    }
    else if (iVar9 == 1) {
      iVar9 = a->w;
      pMVar23 = (Mat *)0x1;
      Mat::create(b,1,sVar1,*(Allocator **)(lVar16 + 8));
      if ((long)iVar9 < 1) {
LAB_0014f441:
        fVar32 = 0.0;
      }
      else {
        fVar32 = 0.0;
        lVar16 = 0;
        do {
          fVar32 = fVar32 + ABS(*(float *)((long)a->data + lVar16 * 4));
          lVar16 = lVar16 + 1;
        } while (iVar9 != lVar16);
      }
LAB_0014f444:
      *(float *)b->data = fVar32;
      unaff_R14D = 0;
      goto LAB_001509ae;
    }
    if (iVar9 == 3) {
      uVar11 = a->w;
      lVar29 = (long)(int)uVar11;
      uVar10 = a->h;
      uVar14 = (ulong)uVar10;
      iVar9 = a->c;
      lVar21 = (long)iVar9;
      uVar30 = uVar10 * uVar11;
      bVar19 = !reduce_w;
      bVar6 = !reduce_h;
      bVar15 = !reduce_c;
      if ((bVar19 || bVar6) || bVar15) {
        if ((bVar19 || bVar6) || reduce_c) {
          pMVar13 = (Mat *)(ulong)uVar11;
          uVar28 = CONCAT71(in_register_00000011,bVar19 || reduce_h) & 0xffffffff;
          bVar22 = (byte)uVar28 | reduce_c;
          pMVar23 = (Mat *)CONCAT71((int7)(uVar28 >> 8),bVar22);
          if (bVar22 == 0) {
            pMVar23 = (Mat *)0x1;
            Mat::create(b,1,uVar10,iVar9,sVar1,*(Allocator **)(lVar16 + 8));
            if (iVar9 < 1) goto LAB_001503c7;
            pvVar18 = a->data;
            sVar1 = a->elemsize;
            pvVar26 = b->data;
            pMVar23 = (Mat *)(b->elemsize * b->cstep);
            sVar2 = a->cstep;
            lVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar28 = 0;
                pvVar27 = pvVar18;
                do {
                  fVar32 = 0.0;
                  if (0 < (int)uVar11) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar32 = fVar32 + ABS(*(float *)((long)pvVar27 + (long)pMVar20 * 4));
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar13 != pMVar20);
                  }
                  *(float *)((long)pvVar26 + uVar28 * 4 + (long)pMVar23 * lVar16) = fVar32;
                  uVar28 = uVar28 + 1;
                  pvVar27 = (void *)((long)pvVar27 + lVar29 * 4);
                } while (uVar28 != uVar14);
              }
              lVar16 = lVar16 + 1;
              pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
            } while (lVar16 != lVar21);
LAB_001503bd:
            unaff_R14D = 0;
          }
          else {
            if ((bVar19 || reduce_h) || bVar15) {
              if ((bVar6 || reduce_w) || bVar15) {
                if ((reduce_w || reduce_h) || bVar15) {
                  bVar19 = true;
                  if ((!bVar6 && !reduce_w) && !reduce_c) {
                    pMVar23 = pMVar13;
                    Mat::create(b,uVar11,1,iVar9,sVar1,*(Allocator **)(lVar16 + 8));
                    sVar1 = b->cstep;
                    uVar30 = b->c * (int)sVar1;
                    if (0 < (int)uVar30) {
                      pMVar23 = (Mat *)0x0;
                      memset(b->data,0,(ulong)uVar30 << 2);
                    }
                    if (iVar9 < 1) goto LAB_001502fd;
                    pvVar18 = a->data;
                    sVar2 = a->elemsize;
                    pMVar23 = (Mat *)b->data;
                    sVar3 = a->cstep;
                    sVar4 = b->elemsize;
                    lVar16 = 0;
                    unaff_R14D = 0;
                    do {
                      if (0 < (int)uVar10) {
                        uVar30 = 0;
                        pvVar26 = pvVar18;
                        do {
                          if (0 < (int)uVar11) {
                            pMVar20 = (Mat *)0x0;
                            do {
                              *(float *)((long)&pMVar23->data + (long)pMVar20 * 4) =
                                   ABS(*(float *)((long)pvVar26 + (long)pMVar20 * 4)) +
                                   *(float *)((long)&pMVar23->data + (long)pMVar20 * 4);
                              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                            } while (pMVar13 != pMVar20);
                          }
                          uVar30 = uVar30 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar11 * 4);
                        } while (uVar30 != uVar10);
                      }
                      lVar16 = lVar16 + 1;
                      pvVar18 = (void *)((long)pvVar18 + sVar2 * sVar3);
                      pMVar23 = (Mat *)((long)&pMVar23->data + sVar1 * sVar4);
                      bVar19 = false;
                    } while (lVar16 != lVar21);
                  }
                }
                else {
                  Mat::create(b,uVar11,uVar10,1,sVar1,*(Allocator **)(lVar16 + 8));
                  uVar11 = b->c * (int)b->cstep;
                  if (0 < (int)uVar11) {
                    pMVar13 = (Mat *)0x0;
                    memset(b->data,0,(ulong)uVar11 << 2);
                  }
                  pMVar23 = pMVar13;
                  if (iVar9 < 1) goto LAB_001502f3;
                  pvVar18 = a->data;
                  sVar1 = a->elemsize;
                  sVar2 = a->cstep;
                  pMVar23 = (Mat *)b->data;
                  lVar16 = 0;
                  unaff_R14D = 0;
                  do {
                    if (0 < (int)uVar30) {
                      uVar14 = 0;
                      do {
                        *(float *)((long)&pMVar23->data + uVar14 * 4) =
                             ABS(*(float *)((long)pvVar18 + uVar14 * 4)) +
                             *(float *)((long)&pMVar23->data + uVar14 * 4);
                        uVar14 = uVar14 + 1;
                      } while (uVar30 != uVar14);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
                    bVar19 = false;
                  } while (lVar16 != lVar21);
                }
                goto LAB_001509a7;
              }
              Mat::create(b,uVar11,1,1,sVar1,*(Allocator **)(lVar16 + 8));
              local_78.elemsize._0_4_ = 0;
              local_78.elemsize._4_4_ = 0;
              local_78.elempack = 0;
              local_78.data = (Mat *)0x0;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.allocator = (Allocator *)0x0;
              local_78.dims = 0;
              local_78.w = 0;
              local_78.h = 0;
              local_78.c = 0;
              local_78.cstep = 0;
              pMVar23 = (Mat *)(ulong)uVar11;
              Mat::create(&local_78,uVar11,1,iVar9,sVar1,*(Allocator **)(lVar16 + 0x10));
              sVar1 = local_78.cstep;
              pMVar20 = (Mat *)local_78.data;
              unaff_R14D = -100;
              if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0))
              {
                uVar30 = (int)local_78.cstep * local_78.c;
                if (0 < (int)uVar30) {
                  pMVar23 = (Mat *)0x0;
                  memset(local_78.data,0,(ulong)uVar30 << 2);
                }
                if (0 < iVar9) {
                  pvVar18 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pMVar23 = (Mat *)(CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)
                                   * sVar1);
                  lVar16 = 0;
                  pMVar12 = pMVar20;
                  do {
                    if (0 < (int)uVar10) {
                      uVar30 = 0;
                      pvVar26 = pvVar18;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar24 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar12->data + (long)pMVar24 * 4) =
                                 ABS(*(float *)((long)pvVar26 + (long)pMVar24 * 4)) +
                                 *(float *)((long)&pMVar12->data + (long)pMVar24 * 4);
                            pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                          } while (pMVar13 != pMVar24);
                        }
                        uVar30 = uVar30 + 1;
                        pvVar26 = (void *)((long)pvVar26 + lVar29 * 4);
                      } while (uVar30 != uVar10);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar18 = (void *)((long)pvVar18 + sVar2 * sVar3);
                    pMVar12 = (Mat *)((long)&pMVar23->data + (long)&pMVar12->data);
                  } while (lVar16 != lVar21);
                }
                uVar10 = b->c * (int)b->cstep;
                if (0 < (int)uVar10) {
                  pMVar23 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar10 << 2);
                }
                if (0 < iVar9) {
                  pMVar23 = (Mat *)(sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                     (undefined4)local_78.elemsize));
                  pvVar18 = b->data;
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar18 + (long)pMVar12 * 4) =
                             *(float *)((long)&pMVar20->data + (long)pMVar12 * 4) +
                             *(float *)((long)pvVar18 + (long)pMVar12 * 4);
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar13 != pMVar12);
                    }
                    lVar16 = lVar16 + 1;
                    pMVar20 = (Mat *)((long)&pMVar23->data + (long)&pMVar20->data);
                  } while (lVar16 != lVar21);
                }
                goto LAB_0015098e;
              }
            }
            else {
              Mat::create(b,1,uVar10,1,sVar1,*(Allocator **)(lVar16 + 8));
              local_78.elemsize._0_4_ = 0;
              local_78.elemsize._4_4_ = 0;
              local_78.elempack = 0;
              local_78.data = (Mat *)0x0;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.allocator = (Allocator *)0x0;
              local_78.dims = 0;
              local_78.w = 0;
              local_78.h = 0;
              local_78.c = 0;
              local_78.cstep = 0;
              pMVar23 = (Mat *)0x1;
              Mat::create(&local_78,1,uVar10,iVar9,sVar1,*(Allocator **)(lVar16 + 0x10));
              sVar1 = local_78.cstep;
              pMVar20 = (Mat *)local_78.data;
              unaff_R14D = -100;
              if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0))
              {
                uVar30 = (int)local_78.cstep * local_78.c;
                if (0 < (int)uVar30) {
                  pMVar23 = (Mat *)0x0;
                  memset(local_78.data,0,(ulong)uVar30 << 2);
                }
                if (0 < iVar9) {
                  pvVar18 = a->data;
                  sVar2 = a->elemsize;
                  sVar3 = a->cstep;
                  pMVar23 = (Mat *)(lVar29 * 4);
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar28 = 0;
                      pvVar26 = pvVar18;
                      do {
                        fVar32 = 0.0;
                        if (0 < (int)uVar11) {
                          pMVar12 = (Mat *)0x0;
                          do {
                            fVar32 = fVar32 + ABS(*(float *)((long)pvVar26 + (long)pMVar12 * 4));
                            pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                          } while (pMVar13 != pMVar12);
                        }
                        *(float *)((long)&pMVar20->data +
                                  uVar28 * 4 +
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                                  sVar1 * lVar16) = fVar32;
                        uVar28 = uVar28 + 1;
                        pvVar26 = (void *)((long)&pMVar23->data + (long)pvVar26);
                      } while (uVar28 != uVar14);
                    }
                    lVar16 = lVar16 + 1;
                    pvVar18 = (void *)((long)pvVar18 + sVar2 * sVar3);
                  } while (lVar16 != lVar21);
                }
                uVar11 = b->c * (int)b->cstep;
                if (0 < (int)uVar11) {
                  pMVar23 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar11 << 2);
                }
                if (0 < iVar9) {
                  pMVar23 = (Mat *)(sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                     (undefined4)local_78.elemsize));
                  pvVar18 = b->data;
                  lVar16 = 0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar28 = 0;
                      do {
                        *(float *)((long)pvVar18 + uVar28 * 4) =
                             *(float *)((long)&pMVar20->data + uVar28 * 4) +
                             *(float *)((long)pvVar18 + uVar28 * 4);
                        uVar28 = uVar28 + 1;
                      } while (uVar14 != uVar28);
                    }
                    lVar16 = lVar16 + 1;
                    pMVar20 = (Mat *)((long)&pMVar23->data + (long)&pMVar20->data);
                  } while (lVar16 != lVar21);
                }
LAB_0015098e:
                unaff_R14D = 0;
              }
            }
LAB_00150991:
            Mat::~Mat(&local_78);
          }
          bVar19 = false;
        }
        else {
          pMVar23 = (Mat *)0x1;
          Mat::create(b,1,1,iVar9,sVar1,*(Allocator **)(lVar16 + 8));
          if (iVar9 < 1) goto LAB_001502fd;
          pvVar18 = a->data;
          sVar1 = a->elemsize;
          pvVar26 = b->data;
          pMVar23 = (Mat *)(b->elemsize * b->cstep);
          sVar2 = a->cstep;
          lVar16 = 0;
          do {
            fVar32 = 0.0;
            if (0 < (int)uVar30) {
              uVar14 = 0;
              do {
                fVar32 = fVar32 + ABS(*(float *)((long)pvVar18 + uVar14 * 4));
                uVar14 = uVar14 + 1;
              } while (uVar30 != uVar14);
            }
            *(float *)((long)pvVar26 + (long)pMVar23 * lVar16) = fVar32;
            lVar16 = lVar16 + 1;
            pvVar18 = (void *)((long)pvVar18 + sVar1 * sVar2);
          } while (lVar16 != lVar21);
LAB_001502f3:
          bVar19 = false;
          unaff_R14D = 0;
        }
      }
      else {
        pMVar23 = (Mat *)0x1;
        Mat::create(b,1,1,1,sVar1,*(Allocator **)(lVar16 + 8));
        plVar5 = *(long **)(lVar16 + 0x10);
        if (iVar9 == 0) {
          piVar17 = (int *)0x0;
          pMVar13 = (Mat *)0x0;
        }
        else {
          uVar14 = sVar1 * lVar21 + 3 & 0xfffffffffffffffc;
          pMVar20 = (Mat *)(uVar14 + 4);
          if (plVar5 == (long *)0x0) {
            local_78.data = (Mat *)0x0;
            pMVar23 = (Mat *)0x10;
            iVar8 = posix_memalign(&local_78.data,0x10,(size_t)pMVar20);
            pMVar13 = (Mat *)local_78.data;
            if (iVar8 != 0) {
              local_78.data = (Mat *)0x0;
              pMVar13 = (Mat *)local_78.data;
            }
          }
          else {
            pMVar13 = (Mat *)(**(code **)(*plVar5 + 0x10))(plVar5);
            pMVar23 = pMVar20;
          }
          piVar17 = (int *)((long)&pMVar13->data + uVar14);
          *(undefined4 *)((long)&pMVar13->data + uVar14) = 1;
        }
        unaff_R14D = -100;
        if ((iVar9 != 0) && (pMVar13 != (Mat *)0x0)) {
          if (iVar9 < 1) {
LAB_0014fe36:
            fVar32 = 0.0;
          }
          else {
            sVar1 = a->elemsize;
            sVar2 = a->cstep;
            pMVar23 = (Mat *)a->data;
            lVar16 = 0;
            do {
              fVar32 = 0.0;
              if (0 < (int)uVar30) {
                uVar14 = 0;
                do {
                  fVar32 = fVar32 + ABS(*(float *)((long)&pMVar23->data + uVar14 * 4));
                  uVar14 = uVar14 + 1;
                } while (uVar30 != uVar14);
              }
              *(float *)((long)&pMVar13->data + lVar16 * 4) = fVar32;
              lVar16 = lVar16 + 1;
              pMVar23 = (Mat *)((long)&pMVar23->data + sVar1 * sVar2);
            } while (lVar16 != lVar21);
            if (iVar9 < 1) goto LAB_0014fe36;
            fVar32 = 0.0;
            lVar16 = 0;
            do {
              fVar32 = fVar32 + *(float *)((long)&pMVar13->data + lVar16 * 4);
              lVar16 = lVar16 + 1;
            } while (lVar21 != lVar16);
          }
          *(float *)b->data = fVar32;
          unaff_R14D = 0;
        }
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (plVar5 == (long *)0x0) goto LAB_001504c5;
            (**(code **)(*plVar5 + 0x18))(plVar5);
            pMVar23 = pMVar13;
            goto LAB_001504bb;
          }
        }
LAB_001504d7:
        bVar19 = false;
      }
      goto LAB_001509a7;
    }
  }
LAB_001509ab:
  unaff_R14D = 0;
LAB_001509ae:
  iVar9 = -100;
  if (unaff_R14D == 0) {
    iVar9 = 0;
    if (1.1920929e-07 < ABS(v0 + -1.0)) {
      reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar23);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}